

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O2

void __thiscall
MeCab::Param::set<std::__cxx11::string>
          (Param *this,char *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,bool rewrite)

{
  iterator iVar1;
  mapped_type *this_00;
  undefined7 in_register_00000009;
  string key2;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,key,(allocator *)&local_58);
  if ((int)CONCAT71(in_register_00000009,rewrite) == 0) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->conf_)._M_t,&local_38);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->conf_)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_0012827f;
  }
  std::__cxx11::string::string((string *)&local_78,(string *)value);
  local_50 = local_70;
  local_58 = local_48;
  if (local_78 == local_68) {
    uStack_40 = uStack_60;
  }
  else {
    local_58 = local_78;
  }
  local_70 = 0;
  local_68[0] = 0;
  local_78 = local_68;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->conf_,&local_38);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
LAB_0012827f:
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void set(const char* key, const T &value,
           bool rewrite = true) {
    std::string key2 = std::string(key);
    if (rewrite || (!rewrite && conf_.find(key2) == conf_.end()))
      conf_[key2] = lexical_cast<std::string, T>(value);
  }